

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O3

void __thiscall GoniometricLight_Sampling_Test::TestBody(GoniometricLight_Sampling_Test *this)

{
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  _func_int ***ppp_Var4;
  RGBColorSpace *imageColorSpace;
  undefined1 auVar5 [64];
  undefined8 uVar6;
  polymorphic_allocator<float> pVar7;
  float *pfVar8;
  int iVar9;
  Allocator AVar10;
  long lVar11;
  int i;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  SampledWavelengths lambda;
  Image image;
  GoniometricLight light;
  undefined1 local_538 [4];
  float afStack_534 [3];
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  local_528;
  size_t local_518;
  size_t local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  LightHandle local_4e0;
  SpectrumHandle local_4d8;
  Image local_4d0;
  undefined1 local_3b8 [160];
  polymorphic_allocator<float> local_318;
  float *local_310;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_308;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_300;
  undefined1 local_2e0 [168];
  polymorphic_allocator<unsigned_char> local_238;
  uchar *local_230;
  size_t local_228;
  size_t local_220;
  polymorphic_allocator<pbrt::Half> local_218;
  Half *local_210;
  size_t local_208;
  size_t local_200;
  polymorphic_allocator<float> local_1f8;
  float *local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  local_1b8;
  polymorphic_allocator<float> local_198;
  float *local_190;
  size_t local_188;
  size_t local_180;
  polymorphic_allocator<float> local_178;
  float *local_170;
  size_t local_168;
  size_t local_160;
  undefined1 local_148 [216];
  undefined1 local_70 [16];
  size_t sStack_60;
  undefined8 uStack_58;
  polymorphic_allocator<float> pStack_50;
  float *pfStack_48;
  size_t sStack_40;
  undefined8 uStack_38;
  
  MakeLightImage(&local_4d0,(Point2i)0x10000000200);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"R","");
  requestedChannels.n = 1;
  requestedChannels.ptr = &local_500;
  pbrt::Image::GetChannelDesc((ImageChannelDesc *)local_538,&local_4d0,requestedChannels);
  AVar10.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::SelectChannels((Image *)local_3b8,&local_4d0,(ImageChannelDesc *)local_538,AVar10);
  this_00 = &local_4d0.channelNames;
  local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_3b8._8_4_;
  local_4d0.format = local_3b8._0_4_;
  local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_3b8._4_4_;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_3b8 + 0x10));
  local_4d0.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )local_308.bits;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (&local_4d0.p8,&local_300);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            (&local_4d0.p16,
             (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_2e0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&local_4d0.p32,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_2e0 + 0x20));
  local_2e0._56_8_ = 0;
  (*(*(_func_int ***)local_2e0._32_8_)[3])
            (local_2e0._32_8_,local_2e0._40_8_,local_2e0._48_8_ << 2,4);
  local_2e0._24_8_ = 0;
  (*(*(_func_int ***)local_2e0._0_8_)[3])(local_2e0._0_8_,local_2e0._8_8_,local_2e0._16_8_ * 2,2);
  local_300.nStored = 0;
  (*(local_300.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_300.alloc.memoryResource,local_300.ptr,local_300.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_3b8 + 0x10));
  local_510 = 0;
  (**(code **)(*(long *)CONCAT44(afStack_534[0],local_538) + 0x18))
            ((long *)CONCAT44(afStack_534[0],local_538),CONCAT44(afStack_534[2],afStack_534[1]),
             local_518 << 2,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (TestBody()::I == '\0') {
    TestBody();
  }
  if (TestBody()::id == '\0') {
    iVar9 = __cxa_guard_acquire(&TestBody()::id);
    if (iVar9 != 0) {
      pbrt::Transform::Transform(&TestBody::id);
      __cxa_guard_release(&TestBody()::id);
    }
  }
  local_538 = (undefined1  [4])0x0;
  afStack_534[0] = 0.0;
  afStack_534[1] = 0.0;
  afStack_534[2] = 0.0;
  local_4d8.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0x100000322d858;
  local_148._0_4_ = local_4d0.format;
  local_148._4_4_ = local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.x;
  local_148._8_4_ = local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.y;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_148 + 0x10),this_00);
  local_148._200_8_ = local_4d0.p8.nAlloc;
  local_148._192_8_ = local_4d0.p8.ptr;
  imageColorSpace = pbrt::RGBColorSpace::sRGB;
  local_4d0.p8.ptr = (uchar *)0x0;
  local_4d0.p8.nAlloc = 0;
  local_148._176_8_ =
       local_4d0.encoding.
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  local_148._184_8_ = local_4d0.p8.alloc.memoryResource;
  local_148._208_8_ = local_4d0.p8.nStored;
  local_4d0.p8.nStored = 0;
  local_70._8_8_ = local_4d0.p16.ptr;
  local_70._0_8_ = local_4d0.p16.alloc.memoryResource;
  sStack_60 = local_4d0.p16.nAlloc;
  uStack_58 = local_4d0.p16.nStored;
  pStack_50.memoryResource = local_4d0.p32.alloc.memoryResource;
  pfStack_48 = local_4d0.p32.ptr;
  sStack_40 = local_4d0.p32.nAlloc;
  auVar12._56_8_ = local_4d0.p32.nStored;
  auVar12._0_56_ = _local_70;
  local_4d0.p16.ptr = (Half *)0x0;
  local_4d0.p16.nAlloc = 0;
  local_4d0.p16.nStored = 0;
  local_4d0.p32.nStored = 0;
  local_4d0.p32.ptr = (float *)0x0;
  local_4d0.p32.nAlloc = 0;
  AVar10.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::GoniometricLight::GoniometricLight
            ((GoniometricLight *)local_3b8,&TestBody::id,(MediumInterface *)local_538,&local_4d8,1.0
             ,(Image *)local_148,imageColorSpace,AVar10);
  uStack_38 = 0;
  auVar13 = _local_70;
  pVar7.memoryResource = pStack_50.memoryResource;
  pfVar8 = pfStack_48;
  ppp_Var4 = &(pStack_50.memoryResource)->_vptr_memory_resource;
  lVar11 = sStack_40 << 2;
  _local_70 = auVar13;
  (*(*ppp_Var4)[3])(pVar7.memoryResource,pfVar8,lVar11,4);
  auVar13 = _local_70;
  uStack_58 = 0;
  auVar5 = _local_70;
  local_70._0_8_ = auVar13._0_8_;
  uVar2 = local_70._0_8_;
  sStack_60 = auVar13._16_8_;
  local_70._8_8_ = auVar13._8_8_;
  uVar6 = local_70._8_8_;
  ppp_Var4 = (_func_int ***)local_70._0_8_;
  lVar11 = sStack_60 * 2;
  _local_70 = auVar5;
  (*(*ppp_Var4)[3])(uVar2,uVar6,lVar11,2);
  local_148._208_8_ = 0;
  lVar11 = 1;
  (*(*(_func_int ***)local_148._184_8_)[3])(local_148._184_8_,local_148._192_8_,local_148._200_8_,1)
  ;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_148 + 0x10));
  afStack_534[0] = 0.0;
  afStack_534[1] = 0.0;
  afStack_534[2] = 0.0;
  auVar13 = ZEXT464(0x4414c000);
  local_538 = (undefined1  [4])0x4414c000;
  do {
    fVar1 = auVar13._0_4_ + 117.5;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),SUB6416(ZEXT464(0x444f8000),0),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar13._16_48_ = auVar12._16_48_;
    auVar13._0_16_ = ZEXT416((uint)fVar1);
    auVar12._4_60_ = auVar13._4_60_;
    auVar12._0_4_ = (float)((uint)bVar3 * (int)(fVar1 + -830.0 + 360.0) + (uint)!bVar3 * (int)fVar1)
    ;
    auVar13 = ZEXT1664(auVar12._0_16_);
    afStack_534[lVar11 + -1] = auVar12._0_4_;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  local_4e0.
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           )((ulong)local_3b8 | 0x4000000000000);
  local_528.fixed[0] = 0x3b0b7034;
  local_528.fixed[1] = 0x3b0b7034;
  local_528._8_8_ = 0x3b0b70343b0b7034;
  testPhiVsSampled(&local_4e0,(SampledWavelengths *)local_538);
  local_160 = 0;
  (*(local_178.memoryResource)->_vptr_memory_resource[3])
            (local_178.memoryResource,local_170,local_168 << 2,4);
  local_180 = 0;
  (*(local_198.memoryResource)->_vptr_memory_resource[3])
            (local_198.memoryResource,local_190,local_188 << 2,4);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_1b8);
  local_1e0 = 0;
  (*(local_1f8.memoryResource)->_vptr_memory_resource[3])
            (local_1f8.memoryResource,local_1f0,local_1e8 << 2,4);
  local_200 = 0;
  (*(local_218.memoryResource)->_vptr_memory_resource[3])
            (local_218.memoryResource,local_210,local_208 * 2,2);
  local_220 = 0;
  (*(local_238.memoryResource)->_vptr_memory_resource[3])
            (local_238.memoryResource,local_230,local_228,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e0);
  local_300.alloc.memoryResource = (memory_resource *)0x0;
  (*(local_318.memoryResource)->_vptr_memory_resource[3])
            (local_318.memoryResource,local_310,local_308.bits << 2,4);
  local_4d0.p32.nStored = 0;
  (*(local_4d0.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_4d0.p32.alloc.memoryResource,local_4d0.p32.ptr,local_4d0.p32.nAlloc << 2,4);
  local_4d0.p16.nStored = 0;
  (*(local_4d0.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_4d0.p16.alloc.memoryResource,local_4d0.p16.ptr,local_4d0.p16.nAlloc * 2,2);
  local_4d0.p8.nStored = 0;
  (*(local_4d0.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_4d0.p8.alloc.memoryResource,local_4d0.p8.ptr,local_4d0.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(this_00);
  return;
}

Assistant:

TEST(GoniometricLight, Sampling) {
    Image image = MakeLightImage({512, 256});
    image = image.SelectChannels(image.GetChannelDesc({"R"}));

    static ConstantSpectrum I(10.);
    static Transform id;
    GoniometricLight light(id, MediumInterface(), &I, 1.f, std::move(image),
                           RGBColorSpace::sRGB, Allocator());
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    testPhiVsSampled(LightHandle(&light), lambda);
}